

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional2::executeTest
          (PipelineStatisticsQueryTestFunctional2 *this,GLenum current_query_target)

{
  GLuint qo_id;
  GLuint qo_bo_id;
  TestContext *test_context;
  bool bVar1;
  ulong uVar2;
  RenderContext *render_context;
  ContextInfo *context_info;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  GLenum value;
  MessageBuilder local_408;
  undefined1 local_281;
  GLuint64 GStack_280;
  bool has_passed;
  GLuint64 expected_value;
  MessageBuilder local_248;
  uint *local_c8;
  PFNQUERYDRAWHANDLERPROC *draw_handler_pfn;
  uint n;
  uint n_query_draw_handlers;
  PFNQUERYDRAWHANDLERPROC query_draw_handlers [12];
  _test_execution_result run_result;
  bool result;
  GLenum current_query_target_local;
  PipelineStatisticsQueryTestFunctional2 *this_local;
  
  run_result.result_uint64._3_1_ = true;
  PipelineStatisticsQueryUtilities::_test_execution_result::_test_execution_result
            ((_test_execution_result *)(query_draw_handlers + 0xb));
  memcpy(&n,&PTR_executeBlitFramebufferTest_0323c450,0x60);
  draw_handler_pfn._4_4_ = 0xc;
  for (draw_handler_pfn._0_4_ = 0; (uint)draw_handler_pfn < 0xc;
      draw_handler_pfn._0_4_ = (uint)draw_handler_pfn + 1) {
    local_c8 = &n + (ulong)(uint)draw_handler_pfn * 2;
    uVar2 = (**(code **)local_c8)(this);
    if ((uVar2 & 1) != 0) {
      qo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id;
      qo_bo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id;
      render_context =
           deqp::Context::getRenderContext
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      m_context);
      test_context = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                     super_TestCase.super_TestNode.m_testCtx;
      context_info = deqp::Context::getContextInfo
                               ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                                super_TestCase.m_context);
      bVar1 = PipelineStatisticsQueryUtilities::executeQuery
                        (current_query_target,qo_id,qo_bo_id,(PFNQUERYDRAWHANDLERPROC)0x0,
                         (void *)0x0,render_context,test_context,context_info,
                         (_test_execution_result *)(query_draw_handlers + 0xb));
      if (bVar1) {
        GStack_280 = 0;
        local_281 = 1;
        local_281 = PipelineStatisticsQueryUtilities::verifyResultValues
                              ((_test_execution_result *)(query_draw_handlers + 0xb),1,
                               &stack0xfffffffffffffd80,
                               (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id != 0,
                               current_query_target,(_draw_call_type *)0x0,(_primitive_type *)0x0,
                               false,(this->super_PipelineStatisticsQueryTestFunctionalBase).
                                     super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                               VERIFICATION_TYPE_EXACT_MATCH);
        if (!(bool)local_281) {
          pTVar3 = tcu::TestContext::getLog
                             ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase
                              .super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_408,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_408,(char (*) [34])"Test failed for iteration index [");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&draw_handler_pfn);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2aea36f);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_408);
          run_result.result_uint64._3_1_ = false;
        }
      }
      else {
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_248,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_248,(char (*) [42])"Query execution failed for query target [");
        PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                  ((string *)&expected_value,
                   (PipelineStatisticsQueryUtilities *)(ulong)current_query_target,value);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&expected_value);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&expected_value);
        tcu::MessageBuilder::~MessageBuilder(&local_248);
        run_result.result_uint64._3_1_ = false;
      }
    }
  }
  return run_result.result_uint64._3_1_;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeTest(glw::GLenum current_query_target)
{
	bool															result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result		run_result;
	const PipelineStatisticsQueryUtilities::PFNQUERYDRAWHANDLERPROC query_draw_handlers[] = {
		executeBlitFramebufferTest,
		executeBufferSubDataTest,
		executeClearBufferfvColorBufferTest,
		executeClearBufferfvDepthBufferTest,
		executeClearBufferivStencilBufferTest,
		executeClearBufferSubDataTest,
		executeClearColorBufferTest,
		executeClearDepthBufferTest,
		executeClearStencilBufferTest,
		executeClearTexSubImageTest,
		executeCopyImageSubDataTest,
		executeTexSubImageTest,
	};
	const unsigned int n_query_draw_handlers = sizeof(query_draw_handlers) / sizeof(query_draw_handlers[0]);

	for (unsigned int n = 0; n < n_query_draw_handlers; ++n)
	{
		const PipelineStatisticsQueryUtilities::PFNQUERYDRAWHANDLERPROC& draw_handler_pfn = query_draw_handlers[n];

		/* Query executors can return false if a given test cannot be executed, given
		 * work environment constraint (eg. insufficient GL version). In case of an error,
		 * they will throw an exception.
		 */
		if (draw_handler_pfn(this))
		{
			if (!PipelineStatisticsQueryUtilities::executeQuery(
					current_query_target, m_qo_id, m_bo_qo_id, DE_NULL, /* pfn_draw */
					DE_NULL,											/* draw_user_arg */
					m_context.getRenderContext(), m_testCtx, m_context.getContextInfo(), &run_result))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Query execution failed for query target "
															   "["
								   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target) << "]"
								   << tcu::TestLog::EndMessage;

				result = false;
			}
			else
			{
				const glw::GLuint64 expected_value = 0;
				bool				has_passed	 = true;

				has_passed = PipelineStatisticsQueryUtilities::verifyResultValues(
					run_result, 1, &expected_value, m_qo_id != 0,  /* should_check_qo_bo_values */
					current_query_target, DE_NULL, DE_NULL, false, /* is_primitive_restart_enabled */
					m_testCtx, PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EXACT_MATCH);

				if (!has_passed)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Test failed for iteration index [" << n << "]."
									   << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* if (run results were obtained successfully) */
		}	 /* if (draw handler executed successfully) */
	}

	return result;
}